

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLogger.cpp
# Opt level: O0

void __thiscall
SLogLib::FileLogger::_WriteMessages
          (FileLogger *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *messages)

{
  FileLoggerPriv *pFVar1;
  lock_guard<std::recursive_mutex> this_00;
  byte bVar2;
  bool bVar3;
  _Ios_Openmode _Var4;
  ostream *poVar5;
  runtime_error *this_01;
  reference pbVar6;
  string *_message;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_1d8 [32];
  stringstream local_1b8 [8];
  stringstream _stream;
  ostream local_1a8 [392];
  lock_guard<std::recursive_mutex> local_20;
  lock_guard<std::recursive_mutex> _lock;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *messages_local;
  FileLogger *this_local;
  
  _lock._M_device = (mutex_type *)messages;
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_20,&this->mPriv->mFileWriteMutex);
  bVar2 = std::ios::operator!((ios *)(&this->mPriv->mFileHandle +
                                     *(long *)(*(long *)this->mPriv + -0x18)));
  if ((bVar2 & 1) != 0) {
    pFVar1 = this->mPriv;
    _Var4 = std::__cxx11::string::c_str();
    std::ofstream::open((char *)pFVar1,_Var4);
    bVar2 = std::ofstream::is_open();
    if ((bVar2 & 1) == 0) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      poVar5 = std::operator<<(local_1a8,"SLogLib: Unable to open ");
      poVar5 = std::operator<<(poVar5,(string *)&this->mPriv->mFileName);
      std::operator<<(poVar5," for writing.");
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(this_01,local_1d8);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  this_00._M_device = _lock._M_device;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)_lock._M_device);
  _message = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this_00._M_device);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&_message), bVar3) {
    pbVar6 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::operator<<((ostream *)this->mPriv,(string *)pbVar6);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  if ((this->mPriv->mHasAutoFlush & 1U) != 0) {
    FlushDevice(this);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void FileLogger::_WriteMessages(const std::vector<std::string>& messages)
{
	std::lock_guard<std::recursive_mutex> _lock(mPriv->mFileWriteMutex);
	
	if(!mPriv->mFileHandle)
	{
		mPriv->mFileHandle.open(mPriv->mFileName.c_str());
		if(!mPriv->mFileHandle.is_open())
		{
			std::stringstream _stream;
			_stream << "SLogLib: Unable to open " << mPriv->mFileName << " for writing.";
			throw std::runtime_error(_stream.str());
		}
	}
	
	for(const std::string& _message : messages)
	{
		mPriv->mFileHandle << _message;
	}
	
	if(mPriv->mHasAutoFlush)
	{
		FlushDevice();
	}
}